

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.cpp
# Opt level: O3

void __thiscall
MinVR::VRDisplayNode::auditValues
          (VRDisplayNode *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *valuesSet,string *treeData)

{
  key_type *__k;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VRDisplayNode *this_00;
  string *treeData_00;
  iterator iVar2;
  ostream *poVar3;
  long *plVar4;
  undefined8 *puVar5;
  VRError *this_01;
  ulong *puVar6;
  size_type *psVar7;
  _Base_ptr p_Var8;
  pointer ppVVar9;
  undefined8 uVar10;
  _List_node_base *p_Var11;
  int local_1d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string *local_70;
  _Base_ptr local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_70 = treeData;
  for (p_Var11 = (this->_valuesAdded).
                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
      p_Var11 != (_List_node_base *)&this->_valuesAdded; p_Var11 = p_Var11->_M_next) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)valuesSet,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var11 + 1));
  }
  p_Var11 = (this->_valuesNeeded).
            super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var11 != (_List_node_base *)&this->_valuesNeeded) {
    p_Var8 = &(valuesSet->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_68 = p_Var8;
    do {
      __k = (key_type *)(p_Var11 + 1);
      iVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&valuesSet->_M_t,__k);
      if (iVar2._M_node == p_Var8) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Missing value in display node tree:",0x23);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
        std::ostream::put('\b');
        poVar3 = (ostream *)std::ostream::flush();
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(local_70->_M_dataplus)._M_p,local_70->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if (*(char *)&p_Var11[3]._M_next == '\x01') {
          this_01 = (VRError *)__cxa_allocate_exception(0xa8);
          std::operator+(&local_90,"Necessary data (",__k);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
          local_1b0._M_dataplus._M_p = (pointer)*plVar4;
          psVar7 = (size_type *)(plVar4 + 2);
          if ((size_type *)local_1b0._M_dataplus._M_p == psVar7) {
            local_1b0.field_2._M_allocated_capacity = *psVar7;
            local_1b0.field_2._8_4_ = (undefined4)plVar4[3];
            local_1b0.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          }
          else {
            local_1b0.field_2._M_allocated_capacity = *psVar7;
          }
          local_1b0._M_string_length = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          (*this->_vptr_VRDisplayNode[2])(&local_110);
          std::operator+(&local_150,&local_1b0,&local_110);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_150);
          local_1d0._M_dataplus._M_p = (pointer)*plVar4;
          psVar7 = (size_type *)(plVar4 + 2);
          if ((size_type *)local_1d0._M_dataplus._M_p == psVar7) {
            local_1d0.field_2._M_allocated_capacity = *psVar7;
            local_1d0.field_2._8_4_ = (undefined4)plVar4[3];
            local_1d0.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          }
          else {
            local_1d0.field_2._M_allocated_capacity = *psVar7;
          }
          local_1d0._M_string_length = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          (*this->_vptr_VRDisplayNode[3])(&local_130);
          std::operator+(&local_190,&local_1d0,&local_130);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_190);
          local_170._M_dataplus._M_p = (pointer)*plVar4;
          psVar7 = (size_type *)(plVar4 + 2);
          if ((size_type *)local_170._M_dataplus._M_p == psVar7) {
            local_170.field_2._M_allocated_capacity = *psVar7;
            local_170.field_2._8_4_ = (undefined4)plVar4[3];
            local_170.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          }
          else {
            local_170.field_2._M_allocated_capacity = *psVar7;
          }
          local_170._M_string_length = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,
                     "Review the construction of the display node tree in your configuration file.",
                     "");
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/display/VRDisplayNode.cpp"
                     ,"");
          local_1d4 = 0x9b;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,
                     "void MinVR::VRDisplayNode::auditValues(std::set<std::string>, const std::string &)"
                     ,"");
          VRError::VRError(this_01,&local_170,&local_d0,&local_f0,&local_1d4,&local_b0);
          __cxa_throw(this_01,&VRError::typeinfo,VRError::~VRError);
        }
        std::operator+(&local_90,"Optional data (",__k);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
        paVar1 = &local_1b0.field_2;
        puVar6 = (ulong *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar6) {
          local_1b0.field_2._M_allocated_capacity = *puVar6;
          local_1b0.field_2._8_4_ = (undefined4)plVar4[3];
          local_1b0.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
          local_1b0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_1b0.field_2._M_allocated_capacity = *puVar6;
          local_1b0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_1b0._M_string_length = plVar4[1];
        *plVar4 = (long)puVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        (*this->_vptr_VRDisplayNode[2])(&local_110);
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != paVar1) {
          uVar10 = local_1b0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_110._M_string_length + local_1b0._M_string_length) {
          uVar10 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            uVar10 = local_110.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar10 < local_110._M_string_length + local_1b0._M_string_length)
          goto LAB_0014348e;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_110,0,(char *)0x0,(ulong)local_1b0._M_dataplus._M_p);
        }
        else {
LAB_0014348e:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_1b0,(ulong)local_110._M_dataplus._M_p);
        }
        psVar7 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_150.field_2._M_allocated_capacity = *psVar7;
          local_150.field_2._8_8_ = puVar5[3];
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar7;
          local_150._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_150._M_string_length = puVar5[1];
        *puVar5 = psVar7;
        puVar5[1] = 0;
        *(undefined1 *)psVar7 = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_150);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        puVar6 = (ulong *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar6) {
          local_1d0.field_2._M_allocated_capacity = *puVar6;
          local_1d0.field_2._8_4_ = (undefined4)plVar4[3];
          local_1d0.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
        }
        else {
          local_1d0.field_2._M_allocated_capacity = *puVar6;
          local_1d0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_1d0._M_string_length = plVar4[1];
        *plVar4 = (long)puVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        (*this->_vptr_VRDisplayNode[3])(&local_130);
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          uVar10 = local_1d0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_130._M_string_length + local_1d0._M_string_length) {
          uVar10 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            uVar10 = local_130.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar10 < local_130._M_string_length + local_1d0._M_string_length)
          goto LAB_001435be;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_130,0,(char *)0x0,(ulong)local_1d0._M_dataplus._M_p);
        }
        else {
LAB_001435be:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_1d0,(ulong)local_130._M_dataplus._M_p);
        }
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        psVar7 = puVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_190.field_2._M_allocated_capacity = *psVar7;
          local_190.field_2._8_8_ = puVar5[3];
        }
        else {
          local_190.field_2._M_allocated_capacity = *psVar7;
          local_190._M_dataplus._M_p = (pointer)*puVar5;
        }
        local_190._M_string_length = puVar5[1];
        *puVar5 = psVar7;
        puVar5[1] = 0;
        *(undefined1 *)psVar7 = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_190);
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        psVar7 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_170.field_2._M_allocated_capacity = *psVar7;
          local_170.field_2._8_4_ = (undefined4)plVar4[3];
          local_170.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
        }
        else {
          local_170.field_2._M_allocated_capacity = *psVar7;
          local_170._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_170._M_string_length = plVar4[1];
        *plVar4 = (long)psVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,
                   "Review the construction of the display node tree in your configuration file.",""
                  );
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/display/VRDisplayNode.cpp"
                   ,"");
        local_1d4 = 0x9e;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,
                   "void MinVR::VRDisplayNode::auditValues(std::set<std::string>, const std::string &)"
                   ,"");
        VRError::VRWarning(&local_170,&local_d0,&local_f0,&local_1d4,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        p_Var8 = local_68;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var11 = p_Var11->_M_next;
    } while (p_Var11 != (_List_node_base *)&this->_valuesNeeded);
  }
  treeData_00 = local_70;
  ppVVar9 = (this->_children).
            super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppVVar9 !=
      (this->_children).
      super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppVVar9;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree(&local_60,&valuesSet->_M_t);
      auditValues(this_00,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_60,treeData_00);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_60);
      ppVVar9 = ppVVar9 + 1;
    } while (ppVVar9 !=
             (this->_children).
             super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void VRDisplayNode::auditValues(std::set<std::string> valuesSet,
                                const std::string &treeData) {

  //std::cerr << " checking: " << _name << std::endl;

  // Add the values supplied by this node to the set of values against which we
  // will check the values needed by this node.
  for (std::list<std::string>::const_iterator it = _valuesAdded.begin();
       it != _valuesAdded.end(); it++) {

    //std:: cerr << "    adding: " << *it << std::endl;

    // Insert it added value into the set from above.
    valuesSet.insert(*it);
  }

  // Run through all the valuesNeeded and see if they are in valuesSet.
  for (std::list<std::pair<std::string, bool> >::const_iterator it = _valuesNeeded.begin();
       it != _valuesNeeded.end(); it++) {

    //std:: cerr << "    needing: " << it->first << std::endl;

    // If the name is not in the value set, print the treeData and throw an error.
    if (valuesSet.find(it->first) == valuesSet.end()) {

      std::cerr << "Missing value in display node tree:" << std::endl
                << treeData << std::endl;

      // We only bomb if the value is required.
      if (it->second) {
        VRERROR("Necessary data (" + it->first + ") is not available to the " + getName() + " (" + getType() + ").",
                "Review the construction of the display node tree in your configuration file.");
      } else {
        VRWARNING("Optional data (" + it->first + ") is not available to the " + getName() + " (" + getType() + ").",
                  "Review the construction of the display node tree in your configuration file.");
      }
    }
  }

  // Recursively audit the children nodes.
  for (std::vector<VRDisplayNode*>::const_iterator it = _children.begin();
       it != _children.end(); it++) {
    (*it)->auditValues(valuesSet, treeData);
  }
}